

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiskTable.cpp
# Opt level: O0

bool __thiscall DiskTableNode::intersect(DiskTableNode *this,DiskTableNode *rhs)

{
  SSTableHeader *pSVar1;
  SSTableHeader *pSVar2;
  bool local_2a;
  bool local_29;
  SSTableHeader *rh;
  SSTableHeader *h;
  DiskTableNode *rhs_local;
  DiskTableNode *this_local;
  
  pSVar1 = getHeader(this);
  pSVar2 = getHeader(rhs);
  if (((pSVar2->key_min < pSVar1->key_min) || (local_29 = true, pSVar1->key_max < pSVar2->key_min))
     && ((pSVar2->key_max < pSVar1->key_min || (local_29 = true, pSVar1->key_max < pSVar2->key_max))
        )) {
    local_2a = false;
    if (pSVar2->key_min <= pSVar1->key_min) {
      local_2a = pSVar1->key_max <= pSVar2->key_max;
    }
    local_29 = local_2a;
  }
  return local_29;
}

Assistant:

bool DiskTableNode::intersect(DiskTableNode &rhs) {
    auto *h = getHeader();
    auto *rh = rhs.getHeader();
    return ((rh->key_min >= h->key_min && rh->key_min <= h->key_max) ||
            (rh->key_max >= h->key_min && rh->key_max <= h->key_max)) ||
           (h->key_min >= rh->key_min && h->key_max <= rh->key_max);
}